

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O1

void __thiscall DMovePolyTo::Tick(DMovePolyTo *this)

{
  double dVar1;
  bool bVar2;
  long lVar3;
  FPolyObj *this_00;
  ulong uVar4;
  double dVar5;
  double dVar6;
  
  lVar3 = (long)po_NumPolyobjs;
  if (0 < lVar3) {
    this_00 = polyobjs;
    do {
      if (this_00->tag == (this->super_DPolyAction).m_PolyObj) goto LAB_004710cb;
      this_00 = this_00 + 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  this_00 = (FPolyObj *)0x0;
LAB_004710cb:
  if (this_00 != (FPolyObj *)0x0) {
    bVar2 = FPolyObj::MovePolyobj(this_00,&this->m_Speedv,false);
    if (bVar2) {
      dVar1 = (this->super_DPolyAction).m_Speed;
      dVar6 = ABS(dVar1);
      dVar5 = (this->super_DPolyAction).m_Dist - dVar6;
      (this->super_DPolyAction).m_Dist = dVar5;
      if (dVar5 <= 0.0) {
        SN_StopSequence(this_00);
        (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])(this);
      }
      else if (dVar5 < dVar6) {
        uVar4 = -(ulong)(dVar1 < 0.0);
        (this->super_DPolyAction).m_Speed = (double)(~uVar4 & (ulong)dVar5 | (ulong)-dVar5 & uVar4);
        dVar1 = (this->m_Target).X;
        dVar5 = (this_00->StartSpot).pos.X;
        (this->m_Speedv).Y = (this->m_Target).Y - (this_00->StartSpot).pos.Y;
        (this->m_Speedv).X = dVar1 - dVar5;
      }
      FPolyObj::UpdateLinks(this_00);
      return;
    }
  }
  return;
}

Assistant:

void DMovePolyTo::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);

	if (poly != NULL)
	{
		if (poly->MovePolyobj (m_Speedv))
		{
			double absSpeed = fabs (m_Speed);
			m_Dist -= absSpeed;
			if (m_Dist <= 0)
			{
				SN_StopSequence (poly);
				Destroy ();
			}
			else if (m_Dist < absSpeed)
			{
				m_Speed = m_Dist * (m_Speed < 0 ? -1 : 1);
				m_Speedv = m_Target - poly->StartSpot.pos;
			}
			poly->UpdateLinks();
		}
	}
}